

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv4destination.h
# Opt level: O2

int __thiscall
jrtplib::
RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
::GotoElement(RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
              *this,RTPIPv4Destination *e)

{
  in_port_t iVar1;
  in_addr_t iVar2;
  HashElement *pHVar3;
  
  pHVar3 = this->table[(ulong)e->ip % 0x207d];
  this->curhashelem = pHVar3;
  iVar2 = (e->rtpaddr).sin_addr.s_addr;
  iVar1 = (e->rtpaddr).sin_port;
  while( true ) {
    if (pHVar3 == (HashElement *)0x0) {
      return -5;
    }
    if (((pHVar3->element).rtpaddr.sin_addr.s_addr == iVar2) &&
       ((pHVar3->element).rtpaddr.sin_port == iVar1)) break;
    pHVar3 = pHVar3->hashnext;
    this->curhashelem = pHVar3;
  }
  return 0;
}

Assistant:

uint32_t GetIP() const									{ return ip; }